

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O1

void __thiscall
iu_ExpressionNotFail_x_iutest_x_Arithmetic_Test::Body
          (iu_ExpressionNotFail_x_iutest_x_Arithmetic_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestFlag TVar2;
  TestPartResultReporterInterface *pTVar3;
  int iVar4;
  TestFlag *pTVar5;
  Variable *pVVar6;
  char *in_R9;
  ScopedSPITestFlag guard_5;
  size_type __dnew;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  ScopedSPITestFlag guard;
  TestFlag local_2fc;
  AssertionHelper local_2f8;
  undefined1 local_2c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  int local_2a0 [2];
  ExpressionLHS<int> local_298;
  long *local_270 [2];
  long local_260 [2];
  char local_250;
  SPIFailureChecker local_248;
  _Alloc_hider local_210;
  _Alloc_hider local_208;
  undefined1 local_200 [24];
  AssertionResult local_1e8;
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  bool local_1a0;
  ios_base local_140 [264];
  int local_38 [2];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_248.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_1e8);
  local_2fc.m_test_flags = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_298,&local_2fc.m_test_flags);
  local_2a0[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator+<int>
            ((ExpressionLHS<int> *)local_2c8,&local_298,local_2a0 + 1);
  local_2a0[0] = 0x2c;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2f8,(ExpressionLHS<int> *)local_2c8,local_2a0);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1c0,(ExpressionResult *)&local_2f8,false);
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,local_1c0._0_8_,(char *)(local_1c0._0_8_ + local_1c0._8_8_));
  local_250 = local_1a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,local_1b0._M_allocated_capacity + 1);
  }
  paVar1 = &local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._8_8_ != &local_2b0) {
    operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_message._M_dataplus._M_p != &local_298.m_message.field_2) {
    operator_delete(local_298.m_message._M_dataplus._M_p,
                    local_298.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_250 == '\0') {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2c8,(internal *)local_270,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() + 2 == 44))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,(char *)local_2c8._0_8_,(allocator<char> *)&local_298);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xd3;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_1c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  iVar4 = (int)local_1e8.m_message._M_dataplus._M_p;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = iVar4;
  local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x17;
  local_1c0._0_8_ = &local_1b0;
  local_1c0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1c0,(ulong)&local_2f8);
  local_1b0._M_allocated_capacity =
       (size_type)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1c0._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1c0._0_8_ + 8) = 'n';
  *(char *)(local_1c0._0_8_ + 9) = ':';
  *(char *)(local_1c0._0_8_ + 10) = ' ';
  *(char *)(local_1c0._0_8_ + 0xb) = '4';
  *(char *)(local_1c0._0_8_ + 0xc) = '2';
  *(char *)(local_1c0._0_8_ + 0xd) = ' ';
  *(char *)(local_1c0._0_8_ + 0xe) = '+';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  *(char *)(local_1c0._0_8_ + 0x10) = '2';
  *(char *)(local_1c0._0_8_ + 0x11) = ' ';
  *(char *)(local_1c0._0_8_ + 0x12) = '=';
  *(char *)(local_1c0._0_8_ + 0x13) = '=';
  *(char *)(local_1c0._0_8_ + 0x14) = ' ';
  *(char *)(local_1c0._0_8_ + 0x15) = '4';
  *(char *)(local_1c0._0_8_ + 0x16) = '4';
  local_1c0._8_8_ = local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1c0._0_8_ +
           (long)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult
            ((AssertionResult *)&local_210,&local_248,(string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
  }
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar3;
  if ((bool)local_200[0x10] == false) {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,local_210._M_p,(allocator<char> *)&local_2f8);
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000d3;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_248,(Fixed *)local_1c0,false);
    if (local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_248.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if (local_210._M_p != local_200) {
    operator_delete(local_210._M_p,local_200._0_8_ + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_248.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_1e8);
  local_2fc.m_test_flags = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_298,&local_2fc.m_test_flags);
  local_2a0[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator-<int>
            ((ExpressionLHS<int> *)local_2c8,&local_298,local_2a0 + 1);
  local_2a0[0] = 0x28;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2f8,(ExpressionLHS<int> *)local_2c8,local_2a0);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1c0,(ExpressionResult *)&local_2f8,false);
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,local_1c0._0_8_,(pointer)(local_1c0._8_8_ + local_1c0._0_8_));
  local_250 = local_1a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._8_8_ != &local_2b0) {
    operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_message._M_dataplus._M_p != &local_298.m_message.field_2) {
    operator_delete(local_298.m_message._M_dataplus._M_p,
                    local_298.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_250 == '\0') {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2c8,(internal *)local_270,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() - 2 == 40))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,(char *)local_2c8._0_8_,(allocator<char> *)&local_298);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xd4;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_1c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  iVar4 = (int)local_1e8.m_message._M_dataplus._M_p;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = iVar4;
  local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x17;
  local_1c0._0_8_ = &local_1b0;
  local_1c0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1c0,(ulong)&local_2f8);
  local_1b0._M_allocated_capacity =
       (size_type)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1c0._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1c0._0_8_ + 8) = 'n';
  *(char *)(local_1c0._0_8_ + 9) = ':';
  *(char *)(local_1c0._0_8_ + 10) = ' ';
  *(char *)(local_1c0._0_8_ + 0xb) = '4';
  *(char *)(local_1c0._0_8_ + 0xc) = '2';
  *(char *)(local_1c0._0_8_ + 0xd) = ' ';
  *(char *)(local_1c0._0_8_ + 0xe) = '-';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  *(char *)(local_1c0._0_8_ + 0x10) = '2';
  *(char *)(local_1c0._0_8_ + 0x11) = ' ';
  *(char *)(local_1c0._0_8_ + 0x12) = '=';
  *(char *)(local_1c0._0_8_ + 0x13) = '=';
  *(char *)(local_1c0._0_8_ + 0x14) = ' ';
  *(char *)(local_1c0._0_8_ + 0x15) = '4';
  *(char *)(local_1c0._0_8_ + 0x16) = '0';
  local_1c0._8_8_ = local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1c0._0_8_ +
           (long)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult
            ((AssertionResult *)&local_210,&local_248,(string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
  }
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar3;
  if ((bool)local_200[0x10] == false) {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,local_210._M_p,(allocator<char> *)&local_2f8);
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000d4;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_248,(Fixed *)local_1c0,false);
    if (local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_248.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if (local_210._M_p != local_200) {
    operator_delete(local_210._M_p,local_200._0_8_ + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_248.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_1e8);
  local_2fc.m_test_flags = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_298,&local_2fc.m_test_flags);
  local_2a0[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator*<int>
            ((ExpressionLHS<int> *)local_2c8,&local_298,local_2a0 + 1);
  local_2a0[0] = 0x54;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2f8,(ExpressionLHS<int> *)local_2c8,local_2a0);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1c0,(ExpressionResult *)&local_2f8,false);
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,local_1c0._0_8_,(pointer)(local_1c0._8_8_ + local_1c0._0_8_));
  local_250 = local_1a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._8_8_ != &local_2b0) {
    operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_message._M_dataplus._M_p != &local_298.m_message.field_2) {
    operator_delete(local_298.m_message._M_dataplus._M_p,
                    local_298.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_250 == '\0') {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2c8,(internal *)local_270,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() * 2 == 84))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,(char *)local_2c8._0_8_,(allocator<char> *)&local_298);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xd5;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_1c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  iVar4 = (int)local_1e8.m_message._M_dataplus._M_p;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = iVar4;
  local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x17;
  local_1c0._0_8_ = &local_1b0;
  local_1c0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1c0,(ulong)&local_2f8);
  local_1b0._M_allocated_capacity =
       (size_type)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1c0._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1c0._0_8_ + 8) = 'n';
  *(char *)(local_1c0._0_8_ + 9) = ':';
  *(char *)(local_1c0._0_8_ + 10) = ' ';
  *(char *)(local_1c0._0_8_ + 0xb) = '4';
  *(char *)(local_1c0._0_8_ + 0xc) = '2';
  *(char *)(local_1c0._0_8_ + 0xd) = ' ';
  *(char *)(local_1c0._0_8_ + 0xe) = '*';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  *(char *)(local_1c0._0_8_ + 0x10) = '2';
  *(char *)(local_1c0._0_8_ + 0x11) = ' ';
  *(char *)(local_1c0._0_8_ + 0x12) = '=';
  *(char *)(local_1c0._0_8_ + 0x13) = '=';
  *(char *)(local_1c0._0_8_ + 0x14) = ' ';
  *(char *)(local_1c0._0_8_ + 0x15) = '8';
  *(char *)(local_1c0._0_8_ + 0x16) = '4';
  local_1c0._8_8_ = local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1c0._0_8_ +
           (long)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult
            ((AssertionResult *)&local_210,&local_248,(string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
  }
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar3;
  if ((bool)local_200[0x10] == false) {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,local_210._M_p,(allocator<char> *)&local_2f8);
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000d5;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_248,(Fixed *)local_1c0,false);
    if (local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_248.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if (local_210._M_p != local_200) {
    operator_delete(local_210._M_p,local_200._0_8_ + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_248.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_1e8);
  local_2fc.m_test_flags = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_298,&local_2fc.m_test_flags);
  local_2a0[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator/<int>
            ((ExpressionLHS<int> *)local_2c8,&local_298,local_2a0 + 1);
  local_2a0[0] = 0x15;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2f8,(ExpressionLHS<int> *)local_2c8,local_2a0);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1c0,(ExpressionResult *)&local_2f8,false);
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,local_1c0._0_8_,(pointer)(local_1c0._8_8_ + local_1c0._0_8_));
  local_250 = local_1a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._8_8_ != &local_2b0) {
    operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_message._M_dataplus._M_p != &local_298.m_message.field_2) {
    operator_delete(local_298.m_message._M_dataplus._M_p,
                    local_298.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_250 == '\0') {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2c8,(internal *)local_270,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() / 2 == 21))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,(char *)local_2c8._0_8_,(allocator<char> *)&local_298);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xd6;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_1c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  iVar4 = (int)local_1e8.m_message._M_dataplus._M_p;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = iVar4;
  local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x17;
  local_1c0._0_8_ = &local_1b0;
  local_1c0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1c0,(ulong)&local_2f8);
  local_1b0._M_allocated_capacity =
       (size_type)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1c0._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1c0._0_8_ + 8) = 'n';
  *(char *)(local_1c0._0_8_ + 9) = ':';
  *(char *)(local_1c0._0_8_ + 10) = ' ';
  *(char *)(local_1c0._0_8_ + 0xb) = '4';
  *(char *)(local_1c0._0_8_ + 0xc) = '2';
  *(char *)(local_1c0._0_8_ + 0xd) = ' ';
  *(char *)(local_1c0._0_8_ + 0xe) = '/';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  *(char *)(local_1c0._0_8_ + 0x10) = '2';
  *(char *)(local_1c0._0_8_ + 0x11) = ' ';
  *(char *)(local_1c0._0_8_ + 0x12) = '=';
  *(char *)(local_1c0._0_8_ + 0x13) = '=';
  *(char *)(local_1c0._0_8_ + 0x14) = ' ';
  *(char *)(local_1c0._0_8_ + 0x15) = '2';
  *(char *)(local_1c0._0_8_ + 0x16) = '1';
  local_1c0._8_8_ = local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1c0._0_8_ +
           (long)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult
            ((AssertionResult *)&local_210,&local_248,(string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
  }
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar3;
  if ((bool)local_200[0x10] == false) {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,local_210._M_p,(allocator<char> *)&local_2f8);
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000d6;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_248,(Fixed *)local_1c0,false);
    if (local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_248.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if (local_210._M_p != local_200) {
    operator_delete(local_210._M_p,local_200._0_8_ + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_248.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_1e8);
  local_2fc.m_test_flags = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_298,&local_2fc.m_test_flags);
  local_2a0[1] = 4;
  iutest::detail::ExpressionLHS<int>::operator%<int>
            ((ExpressionLHS<int> *)local_2c8,&local_298,local_2a0 + 1);
  local_2a0[0] = 2;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2f8,(ExpressionLHS<int> *)local_2c8,local_2a0);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1c0,(ExpressionResult *)&local_2f8,false);
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,local_1c0._0_8_,(pointer)(local_1c0._8_8_ + local_1c0._0_8_));
  local_250 = local_1a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._8_8_ != &local_2b0) {
    operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_message._M_dataplus._M_p != &local_298.m_message.field_2) {
    operator_delete(local_298.m_message._M_dataplus._M_p,
                    local_298.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_250 == '\0') {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2c8,(internal *)local_270,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() % 4 == 2))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,(char *)local_2c8._0_8_,(allocator<char> *)&local_298);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xd7;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_1c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  iVar4 = (int)local_1e8.m_message._M_dataplus._M_p;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = iVar4;
  local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x16;
  local_1c0._0_8_ = &local_1b0;
  local_1c0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1c0,(ulong)&local_2f8);
  local_1b0._M_allocated_capacity =
       (size_type)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1c0._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1c0._0_8_ + 8) = 'n';
  *(char *)(local_1c0._0_8_ + 9) = ':';
  *(char *)(local_1c0._0_8_ + 10) = ' ';
  *(char *)(local_1c0._0_8_ + 0xb) = '4';
  *(char *)(local_1c0._0_8_ + 0xc) = '2';
  *(char *)(local_1c0._0_8_ + 0xd) = ' ';
  *(char *)(local_1c0._0_8_ + 0xe) = '%';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  *(char *)(local_1c0._0_8_ + 0xe) = '%';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  *(char *)(local_1c0._0_8_ + 0x10) = '4';
  *(char *)(local_1c0._0_8_ + 0x11) = ' ';
  *(char *)(local_1c0._0_8_ + 0x12) = '=';
  *(char *)(local_1c0._0_8_ + 0x13) = '=';
  *(char *)(local_1c0._0_8_ + 0x14) = ' ';
  *(char *)(local_1c0._0_8_ + 0x15) = '2';
  local_1c0._8_8_ = local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1c0._0_8_ +
           (long)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult
            ((AssertionResult *)&local_210,&local_248,(string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
  }
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar3;
  if ((bool)local_200[0x10] == false) {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,local_210._M_p,(allocator<char> *)&local_2f8);
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000d7;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_248,(Fixed *)local_1c0,false);
    if (local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_248.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if (local_210._M_p != local_200) {
    operator_delete(local_210._M_p,local_200._0_8_ + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_248.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2fc);
  local_2a0[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)&local_210,local_2a0 + 1);
  local_2a0[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator+<int>
            (&local_298,(ExpressionLHS<int> *)&local_210,local_2a0);
  local_38[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator+<int>
            ((ExpressionLHS<int> *)local_2c8,&local_298,local_38 + 1);
  local_38[0] = 0x7e;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2f8,(ExpressionLHS<int> *)local_2c8,local_38);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1c0,(ExpressionResult *)&local_2f8,false);
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,local_1c0._0_8_,(pointer)(local_1c0._8_8_ + local_1c0._0_8_));
  local_250 = local_1a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._8_8_ != &local_2b0) {
    operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_message._M_dataplus._M_p != &local_298.m_message.field_2) {
    operator_delete(local_298.m_message._M_dataplus._M_p,
                    local_298.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_208._M_p != local_200 + 8) {
    operator_delete(local_208._M_p,local_200._8_8_ + 1);
  }
  if (local_250 == '\0') {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2c8,(internal *)local_270,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() + f() + f() == 126))"
               ,"false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,(char *)local_2c8._0_8_,(allocator<char> *)&local_298);
    local_2f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_2f8.m_part_result.super_iuCodeMessage.m_line = 0xd8;
    local_2f8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_2f8,(Fixed *)local_1c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  TVar2.m_test_flags = local_2fc.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar2.m_test_flags;
  local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x1e;
  local_1c0._0_8_ = &local_1b0;
  local_1c0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1c0,(ulong)&local_2f8);
  local_1b0._M_allocated_capacity =
       (size_type)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1c0._0_8_ + 0xe) = '+';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  *(char *)(local_1c0._0_8_ + 0x10) = '4';
  *(char *)(local_1c0._0_8_ + 0x11) = '2';
  *(char *)(local_1c0._0_8_ + 0x12) = ' ';
  *(char *)(local_1c0._0_8_ + 0x13) = '+';
  *(char *)(local_1c0._0_8_ + 0x14) = ' ';
  *(char *)(local_1c0._0_8_ + 0x15) = '4';
  *(char *)(local_1c0._0_8_ + 0x16) = '2';
  *(char *)(local_1c0._0_8_ + 0x17) = ' ';
  *(char *)(local_1c0._0_8_ + 0x18) = '=';
  *(char *)(local_1c0._0_8_ + 0x19) = '=';
  *(char *)(local_1c0._0_8_ + 0x1a) = ' ';
  *(char *)(local_1c0._0_8_ + 0x1b) = '1';
  *(char *)(local_1c0._0_8_ + 0x1c) = '2';
  *(char *)(local_1c0._0_8_ + 0x1d) = '6';
  *(undefined8 *)local_1c0._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1c0._0_8_ + 8) = 'n';
  *(char *)(local_1c0._0_8_ + 9) = ':';
  *(char *)(local_1c0._0_8_ + 10) = ' ';
  *(char *)(local_1c0._0_8_ + 0xb) = '4';
  *(char *)(local_1c0._0_8_ + 0xc) = '2';
  *(char *)(local_1c0._0_8_ + 0xd) = ' ';
  *(char *)(local_1c0._0_8_ + 0xe) = '+';
  *(char *)(local_1c0._0_8_ + 0xf) = ' ';
  local_1c0._8_8_ = local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1c0._0_8_ +
           (long)local_2f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_1e8,&local_248,(string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
  }
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar3;
  if (local_1e8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1c0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,
               (char *)CONCAT44(local_1e8.m_message._M_dataplus._M_p._4_4_,
                                (int)local_1e8.m_message._M_dataplus._M_p),
               (allocator<char> *)&local_2f8);
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000d8;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_248,(Fixed *)local_1c0,false);
    if (local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_248.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_248.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1e8.m_message._M_dataplus._M_p._4_4_,
                  (int)local_1e8.m_message._M_dataplus._M_p) != &local_1e8.m_message.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1e8.m_message._M_dataplus._M_p._4_4_,
                             (int)local_1e8.m_message._M_dataplus._M_p),
                    local_1e8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(ExpressionNotFail, Arithmetic)
{
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() + 2 == 44), "expansion: 42 + 2 == 44");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() - 2 == 40), "expansion: 42 - 2 == 40");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() * 2 == 84), "expansion: 42 * 2 == 84");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() / 2 == 21), "expansion: 42 / 2 == 21");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() % 4 == 2), "expansion: 42 % 4 == 2");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() + f() + f() == 126), "expansion: 42 + 42 + 42 == 126");
}